

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O1

void __thiscall
QPDFPageLabelDocumentHelper::getLabelsForPageRange
          (QPDFPageLabelDocumentHelper *this,longlong start_idx,longlong end_idx,
          longlong new_start_idx,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_labels)

{
  pointer pQVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  QPDF *pQVar6;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_00;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long value;
  QPDFObjectHandle label;
  QPDFObjectHandle last;
  QPDFObjectHandle last_idx;
  undefined1 local_278 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  QPDFPageLabelDocumentHelper local_238;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_218;
  longlong local_210;
  QPDFObjectHandle local_208;
  QPDFPageLabelDocumentHelper *local_1f8;
  QPDFObjectHandle local_1f0;
  undefined1 local_1e0 [16];
  QPDFObjectHandle local_1d0;
  undefined8 local_1c0 [2];
  QPDFObjectHandle local_1b0;
  QPDFObjectHandle local_1a0;
  QPDFObjectHandle local_190;
  long *local_180 [2];
  long local_170 [2];
  QPDFObjectHandle local_160;
  long *local_150 [2];
  long local_140 [2];
  QPDFObjectHandle local_130;
  long *local_120 [2];
  long local_110 [2];
  QPDFObjectHandle local_100;
  QPDFObjectHandle local_f0;
  QPDFObjectHandle local_e0;
  long *local_d0 [2];
  long local_c0 [2];
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_210 = end_idx;
  local_1f8 = this;
  getLabelForPage((QPDFPageLabelDocumentHelper *)local_278,(longlong)this);
  bVar7 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_278);
  if (bVar7) {
    QPDFObjectHandle::newDictionary();
    uVar5 = local_258._8_8_;
    local_278._0_8_ = local_258._M_allocated_capacity;
    uVar4 = local_278._8_8_;
    local_258._M_allocated_capacity = 0;
    local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_278._8_8_ = uVar5;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
    }
    local_258._M_allocated_capacity = (size_type)&local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"/St","");
    QPDFObjectHandle::newInteger(&local_1f0,new_start_idx + 1);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_278,(string *)&local_258,&local_1f0);
    if (local_1f0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,local_248._M_allocated_capacity + 1);
    }
  }
  pQVar1 = (new_labels->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)(new_labels->
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pQVar1;
  local_218 = new_labels;
  if (1 < (ulong)(lVar15 >> 4)) {
    local_278._16_8_ = *(undefined8 *)((long)pQVar1 + lVar15 + -0x10);
    local_278._24_8_ = *(long *)((long)pQVar1 + lVar15 + -8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._24_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._24_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._24_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._24_8_)->_M_use_count + 1;
      }
    }
    uVar16 = (lVar15 >> 4) - 2;
    pQVar1 = (new_labels->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(new_labels->
                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pQVar1 >> 4) <= uVar16) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    local_208.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = pQVar1[uVar16].super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_208.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&pQVar1[uVar16].super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi;
    if (local_208.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_208.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_208.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_208.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_208.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    bVar7 = QPDFObjectHandle::isInteger(&local_208);
    if ((bVar7) &&
       (bVar7 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_278 + 0x10)), bVar7)) {
      local_1f0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_1e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/S","");
      QPDFObjectHandle::getKey(&local_e0,(string *)local_278);
      QPDFObjectHandle::unparse_abi_cxx11_((string *)&local_258,&local_e0);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/S","");
      QPDFObjectHandle::getKey(&local_f0,(string *)(local_278 + 0x10));
      QPDFObjectHandle::unparse_abi_cxx11_(&local_50,&local_f0);
      bVar7 = true;
      if ((local_258._8_8_ != local_50._M_string_length) ||
         (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
          (iVar10 = bcmp((void *)local_258._M_allocated_capacity,local_50._M_dataplus._M_p,
                         local_258._8_8_), iVar10 != 0)))) goto LAB_001d4418;
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"/P","");
      QPDFObjectHandle::getKey(&local_100,(string *)local_278);
      QPDFObjectHandle::unparse_abi_cxx11_(&local_90,&local_100);
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"/P","");
      QPDFObjectHandle::getKey(&local_130,(string *)(local_278 + 0x10));
      QPDFObjectHandle::unparse_abi_cxx11_(&local_b0,&local_130);
      bVar7 = true;
      if ((local_90._M_string_length != local_b0._M_string_length) ||
         ((local_90._M_string_length != 0 &&
          (iVar10 = bcmp(local_90._M_dataplus._M_p,local_b0._M_dataplus._M_p,
                         local_90._M_string_length), iVar10 != 0)))) {
        bVar8 = true;
        goto LAB_001d441e;
      }
      local_180[0] = local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"/St","");
      QPDFObjectHandle::getKey(&local_160,(string *)local_278);
      bVar7 = QPDFObjectHandle::isInteger(&local_160);
      if (!bVar7) {
        bVar7 = true;
        bVar8 = true;
        bVar3 = true;
        goto LAB_001d4420;
      }
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"/St","");
      QPDFObjectHandle::getKey(&local_190,(string *)(local_278 + 0x10));
      bVar9 = QPDFObjectHandle::isInteger(&local_190);
      bVar7 = true;
      bVar8 = true;
      bVar3 = true;
      bVar2 = true;
    }
    else {
      bVar7 = false;
LAB_001d4418:
      bVar8 = false;
LAB_001d441e:
      bVar3 = false;
LAB_001d4420:
      bVar2 = false;
      bVar9 = false;
    }
    if (bVar2) {
      if (local_190.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_190.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
    }
    new_labels = local_218;
    if (bVar3) {
      if (local_160.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_160.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_180[0] != local_170) {
        operator_delete(local_180[0],local_170[0] + 1);
      }
    }
    if (bVar8) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_130.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_130.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_150[0] != local_140) {
        operator_delete(local_150[0],local_140[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_120[0] != local_110) {
        operator_delete(local_120[0],local_110[0] + 1);
      }
    }
    if (bVar7) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_f0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_allocated_capacity != &local_248) {
        operator_delete((void *)local_258._M_allocated_capacity,local_248._M_allocated_capacity + 1)
        ;
      }
      if (local_e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_1f0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_1e0) {
        operator_delete(local_1f0.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_1e0._0_8_ + 1);
      }
    }
    if (bVar9 != false) {
      local_238.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)&local_238.m;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"/St","");
      QPDFObjectHandle::getKey(&local_1a0,(string *)local_278);
      lVar11 = QPDFObjectHandle::getIntValue(&local_1a0);
      local_1d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"/St","");
      QPDFObjectHandle::getKey(&local_1b0,(string *)(local_278 + 0x10));
      lVar12 = QPDFObjectHandle::getIntValue(&local_1b0);
      if (local_1b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_1d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_1c0) {
        operator_delete(local_1d0.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_1c0[0] + 1);
      }
      if (local_1a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((shared_ptr<QPDFPageLabelDocumentHelper::Members> *)
          local_238.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_238.m) {
        operator_delete(local_238.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                        (ulong)((long)&((local_238.m.
                                         super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->labels).
                                       super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + 1));
      }
      lVar13 = QPDFObjectHandle::getIntValue(&local_208);
      new_labels = local_218;
      if (lVar11 - lVar12 == new_start_idx - lVar13) {
        if (local_208.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_208.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._24_8_);
        }
        goto LAB_001d4778;
      }
    }
    if (local_208.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_208.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._24_8_);
    }
  }
  QPDFObjectHandle::newInteger((QPDFObjectHandle *)&local_238,new_start_idx);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
            (new_labels,(QPDFObjectHandle *)&local_238);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.super_QPDFDocumentHelper.qpdf !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_238.super_QPDFDocumentHelper.qpdf);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            (new_labels,(value_type *)local_278);
LAB_001d4778:
  if (start_idx < local_210) {
    local_210 = -local_210;
    lVar15 = start_idx + 1;
    value = new_start_idx + 1;
    do {
      bVar7 = QPDFNumberTreeObjectHelper::hasIndex
                        ((((local_1f8->m).
                           super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->labels).
                         super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,lVar15);
      if (bVar7) {
        getLabelForPage(&local_238,(longlong)local_1f8);
        pQVar6 = local_238.super_QPDFDocumentHelper.qpdf;
        local_278._0_8_ = local_238.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper;
        uVar4 = local_278._8_8_;
        local_238.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)0x0;
        local_238.super_QPDFDocumentHelper.qpdf = (QPDF *)0x0;
        local_278._8_8_ = pQVar6;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
        }
        bVar8 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_278);
      }
      else {
        bVar8 = false;
      }
      if ((bVar7) &&
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.super_QPDFDocumentHelper.qpdf !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_238.super_QPDFDocumentHelper.qpdf);
      }
      if (bVar8 != false) {
        QPDFObjectHandle::newInteger(&local_1d0,value);
        this_00 = local_218;
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
        emplace_back<QPDFObjectHandle>(local_218,&local_1d0);
        if (local_1d0.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1d0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                  (this_00,(value_type *)local_278);
      }
      lVar14 = local_210 + lVar15;
      lVar15 = lVar15 + 1;
      value = value + 1;
    } while (lVar14 != 0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
  }
  return;
}

Assistant:

void
QPDFPageLabelDocumentHelper::getLabelsForPageRange(
    long long start_idx,
    long long end_idx,
    long long new_start_idx,
    std::vector<QPDFObjectHandle>& new_labels)
{
    // Start off with a suitable label for the first page. For every remaining page, if that page
    // has an explicit entry, copy it. Otherwise, let the subsequent page just sequence from the
    // prior entry. If there is no entry for the first page, fabricate one that would match how the
    // page would look in a new file in which it also didn't have an explicit label.
    QPDFObjectHandle label = getLabelForPage(start_idx);
    if (label.isNull()) {
        label = QPDFObjectHandle::newDictionary();
        label.replaceKey("/St", QPDFObjectHandle::newInteger(1 + new_start_idx));
    }
    // See if the new label is redundant based on the previous entry in the vector. If so, don't add
    // it.
    size_t size = new_labels.size();
    bool skip_first = false;
    if (size >= 2) {
        QPDFObjectHandle last = new_labels.at(size - 1);
        QPDFObjectHandle last_idx = new_labels.at(size - 2);
        if (last_idx.isInteger() && last.isDictionary() &&
            (label.getKey("/S").unparse() == last.getKey("/S").unparse()) &&
            (label.getKey("/P").unparse() == last.getKey("/P").unparse()) &&
            label.getKey("/St").isInteger() && last.getKey("/St").isInteger()) {
            long long int st_delta =
                label.getKey("/St").getIntValue() - last.getKey("/St").getIntValue();
            long long int idx_delta = new_start_idx - last_idx.getIntValue();
            if (st_delta == idx_delta) {
                QTC::TC("qpdf", "QPDFPageLabelDocumentHelper skip first");
                skip_first = true;
            }
        }
    }
    if (!skip_first) {
        new_labels.push_back(QPDFObjectHandle::newInteger(new_start_idx));
        new_labels.push_back(label);
    }

    long long int idx_offset = new_start_idx - start_idx;
    for (long long i = start_idx + 1; i <= end_idx; ++i) {
        if (m->labels->hasIndex(i) && (label = getLabelForPage(i)).isDictionary()) {
            new_labels.push_back(QPDFObjectHandle::newInteger(i + idx_offset));
            new_labels.push_back(label);
        }
    }
}